

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

FName __thiscall AActor::GetSpecies(AActor *this)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 *in_RSI;
  
  iVar4 = *(int *)((long)in_RSI + 0x23c);
  if (iVar4 == 0) {
    if (in_RSI[1] == 0) {
      uVar5 = (**(code **)*in_RSI)();
      in_RSI[1] = uVar5;
    }
    lVar2 = in_RSI[1];
    bVar1 = *(byte *)(*(long *)(lVar2 + 200) + 0x195);
    lVar6 = lVar2;
    while ((lVar3 = lVar2, (bVar1 & 0x20) != 0 &&
           (lVar2 = *(long *)(lVar3 + 0xb0), lVar6 = lVar3, lVar2 != 0))) {
      bVar1 = *(byte *)(*(long *)(lVar2 + 200) + 0x195);
    }
    iVar4 = *(int *)(lVar6 + 0x88);
    *(int *)((long)in_RSI + 0x23c) = iVar4;
  }
  *(int *)&(this->super_DThinker).super_DObject._vptr_DObject = iVar4;
  return (FName)(int)this;
}

Assistant:

FName AActor::GetSpecies()
{
	if (Species != NAME_None)
	{
		return Species;
	}

	PClassActor *thistype = GetClass();

	if (GetDefaultByType(thistype)->flags3 & MF3_ISMONSTER)
	{
		while (thistype->ParentClass)
		{
			if (GetDefaultByType(thistype->ParentClass)->flags3 & MF3_ISMONSTER)
				thistype = static_cast<PClassActor *>(thistype->ParentClass);
			else 
				break;
		}
	}
	return Species = thistype->TypeName; // [GZ] Speeds up future calls.
}